

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

PromiseFulfillerPair<int> * kj::newPromiseAndFulfiller<int>(void)

{
  PromiseFulfiller<int> *pPVar1;
  PromiseNode *pPVar2;
  WeakFulfiller<int> *ptrCopy;
  PromiseFulfillerPair<int> *in_RDI;
  
  pPVar1 = (PromiseFulfiller<int> *)operator_new(0x18);
  pPVar1->_vptr_PromiseFulfiller = (_func_int **)&PTR_fulfill_00436be0;
  pPVar1[1]._vptr_PromiseFulfiller = (_func_int **)&DAT_00436c10;
  pPVar1[2]._vptr_PromiseFulfiller = (_func_int **)0x0;
  pPVar2 = (PromiseNode *)operator_new(0x198);
  pPVar2[1]._vptr_PromiseNode = (_func_int **)0x0;
  pPVar2->_vptr_PromiseNode = (_func_int **)&PTR_onReady_00436c70;
  pPVar2[2]._vptr_PromiseNode = (_func_int **)&PTR_fulfill_00436cb8;
  *(undefined1 *)&pPVar2[3]._vptr_PromiseNode = 0;
  *(undefined1 *)&pPVar2[0x2f]._vptr_PromiseNode = 0;
  *(undefined1 *)&pPVar2[0x30]._vptr_PromiseNode = 1;
  pPVar2[0x31]._vptr_PromiseNode = (_func_int **)(pPVar2 + 2);
  pPVar2[0x32]._vptr_PromiseNode = (_func_int **)pPVar1;
  pPVar1[2]._vptr_PromiseFulfiller = (_func_int **)(pPVar2 + 2);
  (in_RDI->promise).super_PromiseBase.node.disposer =
       (Disposer *)
       &_::HeapDisposer<kj::_::AdapterPromiseNode<int,kj::_::PromiseAndFulfillerAdapter<int>>>::
        instance;
  (in_RDI->promise).super_PromiseBase.node.ptr = pPVar2;
  (in_RDI->fulfiller).disposer = (Disposer *)(pPVar1 + 1);
  (in_RDI->fulfiller).ptr = pPVar1;
  return in_RDI;
}

Assistant:

PromiseFulfillerPair<T> newPromiseAndFulfiller() {
  auto wrapper = _::WeakFulfiller<T>::make();

  Own<_::PromiseNode> intermediate(
      heap<_::AdapterPromiseNode<_::FixVoid<T>, _::PromiseAndFulfillerAdapter<T>>>(*wrapper));
  _::ReducePromises<T> promise(false,
      _::maybeChain(kj::mv(intermediate), implicitCast<T*>(nullptr)));

  return PromiseFulfillerPair<T> { kj::mv(promise), kj::mv(wrapper) };
}